

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O0

int __thiscall
CRegexSearcherSimple::search_back_for_pattern
          (CRegexSearcherSimple *this,re_compiled_pattern *pattern,char *entirestr,char *searchstr,
          size_t searchlen,int *result_len)

{
  int iVar1;
  char *in_RCX;
  re_compiled_pattern *in_RDX;
  CRegexSearcher *in_RSI;
  long in_RDI;
  char *in_R8;
  int *in_R9;
  re_group_register *unaff_retaddr;
  int m;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  *(undefined4 *)(in_RDI + 0x7c) = *(undefined4 *)((long)&(in_RSI->stack_).bufsiz_ + 4);
  clear_group_regs((CRegexSearcherSimple *)0x2acfac);
  iVar1 = CRegexSearcher::search_back_for_pattern
                    (in_RSI,in_RDX,in_RCX,in_R8,(size_t)in_R9,
                     (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     unaff_retaddr);
  if (-1 < iVar1) {
    *(int *)(in_RDI + 0x74) = ((int)in_RCX - (int)in_RDX) - iVar1;
    *(int *)(in_RDI + 0x78) = *(int *)(in_RDI + 0x74) + *in_R9;
  }
  return iVar1;
}

Assistant:

int search_back_for_pattern(const re_compiled_pattern *pattern,
                                const char *entirestr,
                                const char *searchstr, size_t searchlen,
                                int *result_len)
    {
        /* remember the group count from the compiled pattern */
        group_cnt_ = pattern->group_cnt;

        /* clear the group registers */
        clear_group_regs();

        /* search for the compiled pattern using our group register */
        int m = CRegexSearcher::search_back_for_pattern(
            pattern, entirestr, searchstr, searchlen, result_len, regs_);

        /* save the match information on success */
        if (m >= 0)
        {
            match_.start_ofs = searchstr - entirestr - m;
            match_.end_ofs = match_.start_ofs + *result_len;
        }

        /* return the result */
        return m;
    }